

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void list_remove(list *list,node *node)

{
  list *plVar1;
  
  plVar1 = (list *)node->previous;
  if ((list *)node->previous == (list *)0x0) {
    plVar1 = list;
  }
  plVar1->head = node->next;
  plVar1 = (list *)node->next;
  if ((list *)node->next == (list *)0x0) {
    plVar1 = list;
  }
  plVar1->tail = node->previous;
  node->next = (node *)0x0;
  node->previous = (node *)0x0;
  list->size = list->size - 1;
  return;
}

Assistant:

void list_remove(struct list *list, struct node *node)
{
        if (node->previous == NULL) {
                // First element
                list->head = node->next;
        } else {
                node->previous->next = node->next;
        }

        if (node->next == NULL) {
                // Last element
                list->tail = node->previous;
        } else {
                node->next->previous = node->previous;
        }

        node->next = NULL;
        node->previous = NULL;

        --list->size;
}